

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void rc_scene_detection_onepass_rt(AV1_COMP *cpi,EncodeFrameInput *frame_input)

{
  int mi_rows_00;
  int *piVar1;
  int *piVar2;
  uchar *active_map_4x4_00;
  int iVar3;
  int ref_stride;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  void *pvVar9;
  long lVar10;
  undefined8 *in_RSI;
  long *in_RDI;
  RATE_CONTROL *lrc_1;
  LAYER_CONTEXT *lc_1;
  int layer_1;
  int tl_1;
  int sl_1;
  SVC *svc_1;
  RATE_CONTROL *lrc;
  LAYER_CONTEXT *lc;
  int layer;
  int tl;
  int sl;
  SVC *svc;
  uint sad_thresh;
  uint y_sad;
  int best_intmv_row;
  int best_intmv_col;
  int pos_row;
  int pos_col;
  int shift;
  int fac;
  int pts;
  int num_pts;
  int sw_col;
  int sw_row;
  uint64_t thresh_high_motion;
  int block_is_active;
  int sbi_col;
  int sbi_row;
  uchar *active_map_4x4;
  int mi_rows;
  int mi_cols;
  CommonModeInfoParams *mi_params;
  int border;
  int check_light_change;
  int light_change;
  int num_low_var_high_sumdiff;
  uint64_t sum_sq_thresh;
  int sb_rows;
  int sb_cols;
  int sb_size_by_mb;
  int thresh;
  int num_samples;
  uint64_t tmp_sad;
  uint64_t avg_sad;
  BLOCK_SIZE bsize;
  uint32_t min_thresh;
  int num_zero_temp_sad;
  int num_mi_rows;
  int num_mi_cols;
  int height;
  int width;
  int last_src_height;
  int last_src_width;
  int last_src_ystride;
  uint8_t *last_src_y;
  int src_height;
  int src_width;
  int src_ystride;
  uint8_t *src_y;
  YV12_BUFFER_CONFIG *unscaled_last_src;
  YV12_BUFFER_CONFIG *unscaled_src;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  size_t in_stack_fffffffffffffe18;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  uint local_19c;
  BLOCK_SIZE bsize_00;
  uint in_stack_fffffffffffffe7c;
  uint src_stride;
  uint8_t *in_stack_fffffffffffffe80;
  uint8_t *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  int local_164;
  undefined8 in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  int *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  int in_stack_fffffffffffffec0;
  int iVar11;
  int local_13c;
  undefined8 in_stack_fffffffffffffec8;
  sbyte local_118;
  int local_114;
  int local_110;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_a4;
  ulong local_a0;
  ulong local_98;
  uint local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  long local_68;
  long local_50;
  
  piVar1 = (int *)*in_RSI;
  piVar2 = (int *)in_RSI[1];
  local_78 = (int)in_RDI[0x77f7];
  local_7c = *(int *)((long)in_RDI + 0x3bfbc);
  if (1 < (int)in_RDI[0x13a67]) {
    local_78 = (int)in_RDI[0x8467];
    local_7c = *(int *)((long)in_RDI + 0x4233c);
  }
  if ((((local_78 != (int)in_RDI[0x77f8]) || (local_7c != *(int *)((long)in_RDI + 0x3bfc4))) ||
      (piVar1 == (int *)0x0)) || (piVar2 == (int *)0x0)) {
    aom_free((void *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    in_RDI[0x13ac9] = 0;
  }
  if ((piVar1 != (int *)0x0) && (piVar2 != (int *)0x0)) {
    local_50 = *(long *)(piVar1 + 10);
    iVar11 = piVar1[8];
    local_68 = *(long *)(piVar2 + 10);
    iVar7 = piVar2[8];
    if ((*piVar1 == *piVar2) && (piVar1[2] == piVar2[2])) {
      *(undefined4 *)(in_RDI + 0xc0f6) = 0;
      *(undefined4 *)(in_RDI + 0xc10a) = 0;
      in_RDI[0xc10b] = 0;
      in_RDI[0xc0f8] = in_RDI[0xc0f7];
      local_80 = (int)in_RDI[0x7833];
      local_84 = *(int *)((long)in_RDI + 0x3c194);
      if (1 < (int)in_RDI[0x13a67]) {
        local_80 = (int)in_RDI[0x13a90];
        local_84 = *(int *)((long)in_RDI + 0x9d484);
      }
      local_88 = 0;
      local_8c = 10000;
      if (*(int *)((long)in_RDI + 0x4269c) == 1) {
        local_8c = 8000;
      }
      src_stride = in_stack_fffffffffffffe7c;
      if ((int)in_RDI[0xc1bc] != 0) {
        src_stride = in_stack_fffffffffffffe7c & 0xffffff;
        if ((int)in_RDI[0x77f7] * *(int *)((long)in_RDI + 0x3bfbc) < 0x12c01) {
          src_stride = CONCAT13((double)in_RDI[0xc116] <= 10.0 && (double)in_RDI[0xc116] != 10.0,
                                (int3)in_stack_fffffffffffffe7c);
        }
        local_8c = 100000;
        if ((char)(src_stride >> 0x18) != '\0') {
          local_8c = 50000;
        }
      }
      local_98 = 0;
      local_a4 = 0;
      if ((0x12c00 < (int)in_RDI[0x77f7] * *(int *)((long)in_RDI + 0x3bfbc)) ||
         (src_stride = CONCAT13((char)(src_stride >> 0x18),CONCAT12(1,(short)src_stride)),
         10.0 < (double)in_RDI[0xc116] || (double)in_RDI[0xc116] == 10.0)) {
        src_stride = CONCAT13((char)(src_stride >> 0x18),
                              CONCAT12(*(int *)((long)in_RDI + 0x4269c) == 1,(short)src_stride));
      }
      iVar3 = 6;
      if ((char)(src_stride >> 0x10) != '\0') {
        iVar3 = 5;
      }
      if (*(char *)(in_RDI[0x8401] + 0x1c) == '\x0f') {
        ref_stride = *(int *)(in_RDI[0x8401] + 0x20) >> 1;
      }
      else {
        ref_stride = *(int *)(in_RDI[0x8401] + 0x20);
      }
      iVar4 = (local_80 + ref_stride + -1) / ref_stride;
      iVar5 = (local_84 + ref_stride + -1) / ref_stride;
      bsize_00 = true;
      if (*(int *)((long)in_RDI + 0x60814) == 0) {
        bsize_00 = 1 < *(int *)((long)in_RDI + 0x9d33c);
      }
      uVar8 = (uint)bsize_00;
      if (((local_78 == (int)in_RDI[0x77f8]) && (local_7c == *(int *)((long)in_RDI + 0x3bfc4))) &&
         (in_RDI[0x13ac9] == 0)) {
        pvVar9 = aom_calloc(in_stack_fffffffffffffe18,
                            CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        in_RDI[0x13ac9] = (long)pvVar9;
        if (in_RDI[0x13ac9] == 0) {
          aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cpi->src_sad_blk_64x64");
        }
      }
      lVar10 = in_RDI[0x7833];
      mi_rows_00 = *(int *)((long)in_RDI + 0x3c194);
      active_map_4x4_00 = (uchar *)in_RDI[0xe257];
      for (local_ec = 0; local_ec < (int)(iVar5 - uVar8); local_ec = local_ec + 1) {
        for (local_f0 = 0; local_f0 < iVar4; local_f0 = local_f0 + 1) {
          local_f4 = 1;
          if (((int)in_RDI[0xe256] != 0) && (0 < *(int *)((long)in_RDI + 0x60854))) {
            local_f4 = set_block_is_active(active_map_4x4_00,(int)lVar10,mi_rows_00,local_f0,
                                           local_ec);
          }
          if (local_f4 == 0) {
            local_a0 = 0;
          }
          else {
            uVar6 = (**(code **)(*in_RDI + 0xce40))(local_50,iVar11,local_68,iVar7);
            local_a0 = (ulong)uVar6;
          }
          if (in_RDI[0x13ac9] != 0) {
            *(ulong *)(in_RDI[0x13ac9] + (long)(local_f0 + local_ec * iVar4) * 8) = local_a0;
          }
          local_98 = local_a0 + local_98;
          local_a4 = local_a4 + 1;
          if (local_a0 == 0) {
            local_88 = local_88 + 1;
          }
          if ((ulong)in_RDI[0xc10b] < local_a0) {
            in_RDI[0xc10b] = local_a0;
          }
          local_50 = local_50 + 0x40;
          local_68 = local_68 + 0x40;
        }
        local_50 = local_50 + (iVar11 * 0x40 + iVar4 * -0x40);
        local_68 = local_68 + (iVar7 * 0x40 + iVar4 * -0x40);
      }
      if (0 < local_a4) {
        local_98 = local_98 / (ulong)(long)local_a4;
      }
      if ((uint)((int)in_RDI[0xc0f7] * iVar3) < local_8c) {
        local_19c = local_8c;
      }
      else {
        local_19c = (int)in_RDI[0xc0f7] * iVar3;
      }
      if (((local_19c < local_98) && ((int)in_RDI[0x13a67] + 1 < (int)in_RDI[0xc0f4])) &&
         (SBORROW4(local_88,(local_a4 >> 2) * 3) != local_88 + (local_a4 >> 2) * -3 < 0)) {
        *(undefined4 *)(in_RDI + 0xc0f6) = 1;
      }
      else {
        *(undefined4 *)(in_RDI + 0xc0f6) = 0;
      }
      in_RDI[0xc0f7] = in_RDI[0xc0f7] * 3 + local_98 >> 2;
      in_RDI[0xc0f9] = local_98;
      if (0 < local_a4) {
        *(int *)(in_RDI + 0xc10a) = ((local_a4 - local_88) * 100) / local_a4;
      }
      if (in_RDI[0xc0f9] != 0) {
        *(undefined4 *)(in_RDI + 0xc0fb) = 0;
      }
      if ((int)in_RDI[0xc0f6] != 0) {
        *(undefined4 *)((long)in_RDI + 0x607e4) = 0;
        *(undefined4 *)(in_RDI + 0xc0fb) = 1;
      }
      if ((*(int *)((long)in_RDI + 0x9d334) == 0) && ((int)in_RDI[0xc103] < 3)) {
        *(undefined4 *)((long)in_RDI + 0x607b4) = 0;
        if ((((10 < *(int *)((long)in_RDI + 0x4272c)) &&
             ((((*(int *)((long)in_RDI + 0x4269c) == 1 && (0x28 < (int)in_RDI[0xc10a])) &&
               (0x9000 < (ulong)in_RDI[0xc0f8])) &&
              ((0x9000 < (ulong)in_RDI[0xc0f7] && ((int)in_RDI[0xc109] < 0x3c)))))) &&
            (0x4ff < *piVar1)) &&
           ((0x2cf < piVar1[2] &&
            (*(undefined4 *)((long)in_RDI + 0x607b4) = 1, *(int *)(in_RDI[0x8401] + 0x48) == 8)))) {
          iVar11 = 0xc0;
          if (20000 < (ulong)in_RDI[0xc0f9]) {
            iVar11 = 0x200;
          }
          iVar7 = 0xa0;
          if (20000 < (ulong)in_RDI[0xc0f9]) {
            iVar7 = 0x200;
          }
          iVar3 = 1;
          if (0x1fa3ff < *piVar1 * piVar1[2]) {
            iVar3 = 3;
          }
          for (local_110 = 0; local_110 < iVar3; local_110 = local_110 + 1) {
            local_114 = 1;
            local_118 = 1;
            if (local_110 == 1) {
              local_114 = 1;
              local_118 = 2;
            }
            else if (local_110 == 2) {
              local_114 = 3;
              local_118 = 2;
            }
            local_1ac = (local_114 * *piVar1 >> local_118) + -0x40;
            local_1bc = (local_114 * piVar1[2] >> local_118) + -0x40;
            local_1a4 = local_1ac;
            if ((*piVar1 - iVar7) + -1 < local_1ac) {
              local_1a4 = (*piVar1 - iVar7) + -1;
            }
            local_1a8 = iVar7;
            if (iVar7 <= local_1a4) {
              if ((*piVar1 - iVar7) + -1 < local_1ac) {
                local_1ac = (*piVar1 - iVar7) + -1;
              }
              local_1a8 = local_1ac;
            }
            local_1b4 = local_1bc;
            if ((piVar1[2] - iVar11) + -1 < local_1bc) {
              local_1b4 = (piVar1[2] - iVar11) + -1;
            }
            local_1b8 = iVar11;
            if (iVar11 <= local_1b4) {
              if ((piVar1[2] - iVar11) + -1 < local_1bc) {
                local_1bc = (piVar1[2] - iVar11) + -1;
              }
              local_1b8 = local_1bc;
            }
            if ((((-1 < local_1a8) && (local_1a8 < *piVar1 + -0x40)) && (-1 < local_1b8)) &&
               (local_1b8 < piVar1[2] + -0x40)) {
              iVar5 = 0;
              uVar8 = estimate_scroll_motion
                                ((AV1_COMP *)
                                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                 in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,src_stride,
                                 ref_stride,bsize_00,(int)in_stack_fffffffffffffea0,
                                 (int)in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,
                                 (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8
                                                ),in_stack_fffffffffffffec0,
                                 (int)in_stack_fffffffffffffec8);
              iVar4 = iVar5;
              if (iVar5 < 1) {
                iVar4 = -iVar5;
              }
              uVar6 = 0x96;
              if (0x96 < iVar4) {
                uVar6 = 300;
              }
              if (uVar8 < uVar6) {
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                if (0x10 < iVar5) {
                  *(undefined4 *)((long)in_RDI + 0x607b4) = 0;
                  break;
                }
              }
            }
          }
        }
        if ((1 < (int)in_RDI[0x13a67]) || (1 < *(int *)((long)in_RDI + 0x9d33c))) {
          for (local_13c = 0; local_13c < (int)in_RDI[0x13a67]; local_13c = local_13c + 1) {
            for (iVar11 = 1; iVar11 < *(int *)((long)in_RDI + 0x9d33c); iVar11 = iVar11 + 1) {
              *(undefined4 *)
               (in_RDI[0x13a91] +
                (long)(local_13c * *(int *)((long)in_RDI + 0x9d33c) + iVar11) * 0x3380 + 0x44) =
                   *(undefined4 *)((long)in_RDI + 0x607b4);
            }
          }
        }
      }
      if (1 < (int)in_RDI[0x13a67]) {
        for (local_164 = 0; local_164 < (int)in_RDI[0x13a67]; local_164 = local_164 + 1) {
          lVar10 = in_RDI[0x13a91] +
                   (long)(local_164 * *(int *)((long)in_RDI + 0x9d33c) +
                         *(int *)((long)in_RDI + 0x9d334)) * 0x3380;
          *(int *)(lVar10 + 0x40) = (int)in_RDI[0xc0f6];
          *(long *)(lVar10 + 0x58) = in_RDI[0xc0f9];
          *(long *)(lVar10 + 0x48) = in_RDI[0xc0f7];
          *(int *)(lVar10 + 0xe0) = (int)in_RDI[0xc10a];
          *(long *)(lVar10 + 0xe8) = in_RDI[0xc10b];
        }
      }
    }
    else {
      aom_free((void *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      in_RDI[0x13ac9] = 0;
    }
  }
  return;
}

Assistant:

static void rc_scene_detection_onepass_rt(AV1_COMP *cpi,
                                          const EncodeFrameInput *frame_input) {
  AV1_COMMON *const cm = &cpi->common;
  RATE_CONTROL *const rc = &cpi->rc;
  YV12_BUFFER_CONFIG const *const unscaled_src = frame_input->source;
  YV12_BUFFER_CONFIG const *const unscaled_last_src = frame_input->last_source;
  uint8_t *src_y;
  int src_ystride;
  int src_width;
  int src_height;
  uint8_t *last_src_y;
  int last_src_ystride;
  int last_src_width;
  int last_src_height;
  int width = cm->width;
  int height = cm->height;
  if (cpi->svc.number_spatial_layers > 1) {
    width = cpi->oxcf.frm_dim_cfg.width;
    height = cpi->oxcf.frm_dim_cfg.height;
  }
  if (width != cm->render_width || height != cm->render_height ||
      unscaled_src == NULL || unscaled_last_src == NULL) {
    aom_free(cpi->src_sad_blk_64x64);
    cpi->src_sad_blk_64x64 = NULL;
  }
  if (unscaled_src == NULL || unscaled_last_src == NULL) return;
  src_y = unscaled_src->y_buffer;
  src_ystride = unscaled_src->y_stride;
  src_width = unscaled_src->y_width;
  src_height = unscaled_src->y_height;
  last_src_y = unscaled_last_src->y_buffer;
  last_src_ystride = unscaled_last_src->y_stride;
  last_src_width = unscaled_last_src->y_width;
  last_src_height = unscaled_last_src->y_height;
  if (src_width != last_src_width || src_height != last_src_height) {
    aom_free(cpi->src_sad_blk_64x64);
    cpi->src_sad_blk_64x64 = NULL;
    return;
  }
  rc->high_source_sad = 0;
  rc->percent_blocks_with_motion = 0;
  rc->max_block_source_sad = 0;
  rc->prev_avg_source_sad = rc->avg_source_sad;
  int num_mi_cols = cm->mi_params.mi_cols;
  int num_mi_rows = cm->mi_params.mi_rows;
  if (cpi->svc.number_spatial_layers > 1) {
    num_mi_cols = cpi->svc.mi_cols_full_resoln;
    num_mi_rows = cpi->svc.mi_rows_full_resoln;
  }
  int num_zero_temp_sad = 0;
  uint32_t min_thresh =
      (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN) ? 8000 : 10000;
  if (cpi->sf.rt_sf.higher_thresh_scene_detection) {
    min_thresh = cm->width * cm->height <= 320 * 240 && cpi->framerate < 10.0
                     ? 50000
                     : 100000;
  }
  const BLOCK_SIZE bsize = BLOCK_64X64;
  // Loop over sub-sample of frame, compute average sad over 64x64 blocks.
  uint64_t avg_sad = 0;
  uint64_t tmp_sad = 0;
  int num_samples = 0;
  const int thresh =
      ((cm->width * cm->height <= 320 * 240 && cpi->framerate < 10.0) ||
       (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN))
          ? 5
          : 6;
  // SAD is computed on 64x64 blocks
  const int sb_size_by_mb = (cm->seq_params->sb_size == BLOCK_128X128)
                                ? (cm->seq_params->mib_size >> 1)
                                : cm->seq_params->mib_size;
  const int sb_cols = (num_mi_cols + sb_size_by_mb - 1) / sb_size_by_mb;
  const int sb_rows = (num_mi_rows + sb_size_by_mb - 1) / sb_size_by_mb;
  uint64_t sum_sq_thresh = 10000;  // sum = sqrt(thresh / 64*64)) ~1.5
  int num_low_var_high_sumdiff = 0;
  int light_change = 0;
  // Flag to check light change or not.
  const int check_light_change = 0;
  // TODO(marpan): There seems some difference along the bottom border when
  // using the source_last_tl0 for last_source (used for temporal layers or
  // when previous frame is dropped).
  // Remove this border parameter when issue is resolved: difference is that
  // non-zero sad exists along bottom border even though source is static.
  const int border =
      rc->prev_frame_is_dropped || cpi->svc.number_temporal_layers > 1;
  // Store blkwise SAD for later use
  if (width == cm->render_width && height == cm->render_height) {
    if (cpi->src_sad_blk_64x64 == NULL) {
      CHECK_MEM_ERROR(cm, cpi->src_sad_blk_64x64,
                      (uint64_t *)aom_calloc(sb_cols * sb_rows,
                                             sizeof(*cpi->src_sad_blk_64x64)));
    }
  }
  const CommonModeInfoParams *const mi_params = &cpi->common.mi_params;
  const int mi_cols = mi_params->mi_cols;
  const int mi_rows = mi_params->mi_rows;
  unsigned char *const active_map_4x4 = cpi->active_map.map;
  // Avoid bottom and right border.
  for (int sbi_row = 0; sbi_row < sb_rows - border; ++sbi_row) {
    for (int sbi_col = 0; sbi_col < sb_cols; ++sbi_col) {
      int block_is_active = 1;
      if (cpi->active_map.enabled && rc->percent_blocks_inactive > 0) {
        block_is_active = set_block_is_active(active_map_4x4, mi_cols, mi_rows,
                                              sbi_col, sbi_row);
      }
      if (block_is_active) {
        tmp_sad = cpi->ppi->fn_ptr[bsize].sdf(src_y, src_ystride, last_src_y,
                                              last_src_ystride);
      } else {
        tmp_sad = 0;
      }
      if (cpi->src_sad_blk_64x64 != NULL)
        cpi->src_sad_blk_64x64[sbi_col + sbi_row * sb_cols] = tmp_sad;
      if (check_light_change) {
        unsigned int sse, variance;
        variance = cpi->ppi->fn_ptr[bsize].vf(src_y, src_ystride, last_src_y,
                                              last_src_ystride, &sse);
        // Note: sse - variance = ((sum * sum) >> 12)
        // Detect large lighting change.
        if (variance < (sse >> 1) && (sse - variance) > sum_sq_thresh) {
          num_low_var_high_sumdiff++;
        }
      }
      avg_sad += tmp_sad;
      num_samples++;
      if (tmp_sad == 0) num_zero_temp_sad++;
      if (tmp_sad > rc->max_block_source_sad)
        rc->max_block_source_sad = tmp_sad;

      src_y += 64;
      last_src_y += 64;
    }
    src_y += (src_ystride << 6) - (sb_cols << 6);
    last_src_y += (last_src_ystride << 6) - (sb_cols << 6);
  }
  if (check_light_change && num_samples > 0 &&
      num_low_var_high_sumdiff > (num_samples >> 1))
    light_change = 1;
  if (num_samples > 0) avg_sad = avg_sad / num_samples;
  // Set high_source_sad flag if we detect very high increase in avg_sad
  // between current and previous frame value(s). Use minimum threshold
  // for cases where there is small change from content that is completely
  // static.
  if (!light_change &&
      avg_sad >
          AOMMAX(min_thresh, (unsigned int)(rc->avg_source_sad * thresh)) &&
      rc->frames_since_key > 1 + cpi->svc.number_spatial_layers &&
      num_zero_temp_sad < 3 * (num_samples >> 2))
    rc->high_source_sad = 1;
  else
    rc->high_source_sad = 0;
  rc->avg_source_sad = (3 * rc->avg_source_sad + avg_sad) >> 2;
  rc->frame_source_sad = avg_sad;
  if (num_samples > 0)
    rc->percent_blocks_with_motion =
        ((num_samples - num_zero_temp_sad) * 100) / num_samples;
  if (rc->frame_source_sad > 0) rc->static_since_last_scene_change = 0;
  if (rc->high_source_sad) {
    cpi->rc.frames_since_scene_change = 0;
    rc->static_since_last_scene_change = 1;
  }
  // Update the high_motion_content_screen_rtc flag on TL0. Avoid the update
  // if too many consecutive frame drops occurred.
  const uint64_t thresh_high_motion = 9 * 64 * 64;
  if (cpi->svc.temporal_layer_id == 0 && rc->drop_count_consec < 3) {
    cpi->rc.high_motion_content_screen_rtc = 0;
    if (cpi->oxcf.speed >= 11 &&
        cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN &&
        rc->percent_blocks_with_motion > 40 &&
        rc->prev_avg_source_sad > thresh_high_motion &&
        rc->avg_source_sad > thresh_high_motion &&
        rc->avg_frame_low_motion < 60 && unscaled_src->y_width >= 1280 &&
        unscaled_src->y_height >= 720) {
      cpi->rc.high_motion_content_screen_rtc = 1;
      // Compute fast coarse/global motion for 128x128 superblock centered
      // at middle of frame, and one to the upper left and one to lower right.
      // to determine if motion is scroll. Only test 3 points (pts) for now.
      // TODO(marpan): Only allow for 8 bit-depth for now.
      if (cm->seq_params->bit_depth == 8) {
        const int sw_row = (cpi->rc.frame_source_sad > 20000) ? 512 : 192;
        const int sw_col = (cpi->rc.frame_source_sad > 20000) ? 512 : 160;
        const int num_pts =
            unscaled_src->y_width * unscaled_src->y_height >= 1920 * 1080 ? 3
                                                                          : 1;
        for (int pts = 0; pts < num_pts; pts++) {
          // fac and shift are used to move the center block for the other
          // two points (pts).
          int fac = 1;
          int shift = 1;
          if (pts == 1) {
            fac = 1;
            shift = 2;
          } else if (pts == 2) {
            fac = 3;
            shift = 2;
          }
          int pos_col = (fac * unscaled_src->y_width >> shift) - 64;
          int pos_row = (fac * unscaled_src->y_height >> shift) - 64;
          pos_col = AOMMAX(sw_col,
                           AOMMIN(unscaled_src->y_width - sw_col - 1, pos_col));
          pos_row = AOMMAX(
              sw_row, AOMMIN(unscaled_src->y_height - sw_row - 1, pos_row));
          if (pos_col >= 0 && pos_col < unscaled_src->y_width - 64 &&
              pos_row >= 0 && pos_row < unscaled_src->y_height - 64) {
            src_y = unscaled_src->y_buffer + pos_row * src_ystride + pos_col;
            last_src_y = unscaled_last_src->y_buffer +
                         pos_row * last_src_ystride + pos_col;
            int best_intmv_col = 0;
            int best_intmv_row = 0;
            unsigned int y_sad = estimate_scroll_motion(
                cpi, src_y, last_src_y, src_ystride, last_src_ystride,
                BLOCK_128X128, pos_col, pos_row, &best_intmv_col,
                &best_intmv_row, sw_col, sw_row);
            unsigned int sad_thresh =
                (abs(best_intmv_col) > 150 || abs(best_intmv_row) > 150) ? 300
                                                                         : 150;
            if (y_sad < sad_thresh &&
                (abs(best_intmv_col) > 16 || abs(best_intmv_row) > 16)) {
              cpi->rc.high_motion_content_screen_rtc = 0;
              break;
            }
          }
        }
      }
    }
    // Pass the flag value to all layer frames.
    if (cpi->svc.number_spatial_layers > 1 ||
        cpi->svc.number_temporal_layers > 1) {
      SVC *svc = &cpi->svc;
      for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
        for (int tl = 1; tl < svc->number_temporal_layers; ++tl) {
          const int layer =
              LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
          LAYER_CONTEXT *lc = &svc->layer_context[layer];
          RATE_CONTROL *lrc = &lc->rc;
          lrc->high_motion_content_screen_rtc =
              rc->high_motion_content_screen_rtc;
        }
      }
    }
  }
  // Scene detection is only on base SLO, and using full/original resolution.
  // Pass the state to the upper spatial layers.
  if (cpi->svc.number_spatial_layers > 1) {
    SVC *svc = &cpi->svc;
    for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
      int tl = svc->temporal_layer_id;
      const int layer = LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
      LAYER_CONTEXT *lc = &svc->layer_context[layer];
      RATE_CONTROL *lrc = &lc->rc;
      lrc->high_source_sad = rc->high_source_sad;
      lrc->frame_source_sad = rc->frame_source_sad;
      lrc->avg_source_sad = rc->avg_source_sad;
      lrc->percent_blocks_with_motion = rc->percent_blocks_with_motion;
      lrc->max_block_source_sad = rc->max_block_source_sad;
    }
  }
}